

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

string * __thiscall
polyscope::modeName_abi_cxx11_(string *__return_storage_ptr__,polyscope *this,TransparencyMode *m)

{
  int iVar1;
  allocator *paVar2;
  char *pcVar3;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  iVar1 = *(int *)this;
  if (iVar1 == 2) {
    pcVar3 = "Pretty";
    paVar2 = &local_b;
  }
  else if (iVar1 == 1) {
    pcVar3 = "Simple";
    paVar2 = &local_a;
  }
  else if (iVar1 == 0) {
    pcVar3 = "None";
    paVar2 = &local_9;
  }
  else {
    pcVar3 = "";
    paVar2 = &local_c;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar3,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string modeName(const TransparencyMode& m) {
  switch (m) {
  case TransparencyMode::None:
    return "None";
  case TransparencyMode::Simple:
    return "Simple";
  case TransparencyMode::Pretty:
    return "Pretty";
  }
  return "";
}